

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_label.cc
# Opt level: O0

bool summarize_holdout_set(vw *all,size_t *no_win_counter)

{
  bool bVar1;
  long *in_RSI;
  long *in_RDI;
  float fVar2;
  float thisLoss;
  float in_stack_ffffffffffffffdc;
  bool local_1;
  
  if (*(double *)(*in_RDI + 0xa0) <= 0.0) {
    fVar2 = 1.7014117e+38;
  }
  else {
    fVar2 = (float)(*(double *)(*in_RDI + 0xa8) / *(double *)(*in_RDI + 0xa0));
  }
  if (in_RDI[4] != 0) {
    fVar2 = accumulate_scalar((vw *)CONCAT44(fVar2,fVar2),in_stack_ffffffffffffffdc);
  }
  *(undefined8 *)(*in_RDI + 0xa0) = 0;
  *(undefined8 *)(*in_RDI + 0xa8) = 0;
  if ((double)fVar2 < *(double *)(*in_RDI + 0x98)) {
    *(double *)(*in_RDI + 0x98) = (double)fVar2;
    *(long *)(*in_RDI + 0xb0) = in_RDI[9];
    *in_RSI = 0;
    local_1 = true;
  }
  else {
    if (((fVar2 != 3.4028235e+38) || (NAN(fVar2))) ||
       (bVar1 = std::isfinite(*(double *)(*in_RDI + 0x98)), bVar1)) {
      *in_RSI = *in_RSI + 1;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool summarize_holdout_set(vw& all, size_t& no_win_counter)
{
  float thisLoss = (all.sd->weighted_holdout_examples_since_last_pass > 0)
      ? (float)(all.sd->holdout_sum_loss_since_last_pass / all.sd->weighted_holdout_examples_since_last_pass)
      : FLT_MAX * 0.5f;
  if (all.all_reduce != nullptr)
    thisLoss = accumulate_scalar(all, thisLoss);

  all.sd->weighted_holdout_examples_since_last_pass = 0;
  all.sd->holdout_sum_loss_since_last_pass = 0;

  if (thisLoss < all.sd->holdout_best_loss)
  {
    all.sd->holdout_best_loss = thisLoss;
    all.sd->holdout_best_pass = all.current_pass;
    no_win_counter = 0;
    return true;
  }

  if ((thisLoss != FLT_MAX) ||
      (isfinite(
          all.sd->holdout_best_loss)))  // it's only a loss if we're not infinite when the previous one wasn't infinite
    no_win_counter++;
  return false;
}